

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Marshall.c
# Opt level: O2

WJTL_STATUS TestMarshallArrayStructs(void)

{
  WJTL_STATUS WVar1;
  WJTL_STATUS WVar2;
  WJTL_STATUS WVar3;
  long lVar4;
  long lVar5;
  undefined8 *puVar6;
  JlMarshallElement *pJVar7;
  undefined8 local_300;
  InnerStructX1 local_2f8;
  undefined8 local_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  OuterStructX theStructX;
  JlMarshallElement marshalStructX2 [1];
  JlMarshallElement marshalStructX1 [1];
  JlMarshallElement marshalOuterX [4];
  
  lVar5 = 0xc;
  puVar6 = &DAT_00142490;
  pJVar7 = marshalStructX1;
  for (lVar4 = lVar5; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined8 *)pJVar7 = *puVar6;
    puVar6 = puVar6 + 1;
    pJVar7 = (JlMarshallElement *)&pJVar7->Name;
  }
  marshalOuterX[2].ChildStructDescription = marshalStructX2;
  puVar6 = &DAT_001424f0;
  pJVar7 = marshalOuterX[2].ChildStructDescription;
  for (; lVar5 != 0; lVar5 = lVar5 + -1) {
    *(undefined8 *)pJVar7 = *puVar6;
    puVar6 = puVar6 + 1;
    pJVar7 = (JlMarshallElement *)&pJVar7->Name;
  }
  marshalOuterX[0].Type = JL_DATA_TYPE_DICTIONARY;
  marshalOuterX[0].Name = "struct1Fixed";
  marshalOuterX[0].IsArray = true;
  marshalOuterX[0].FieldOffset = 0;
  marshalOuterX[0].FieldSize = 0x20;
  marshalOuterX[0].CountFieldOffset = 0x20;
  marshalOuterX[0].CountFieldSize = 8;
  marshalOuterX[0].ArrayFieldSize = 0x20;
  marshalOuterX[0].ArrayItemSize = 8;
  marshalOuterX[0].NumberType = JL_NUM_TYPE_NONE;
  marshalOuterX[0].IsHex = false;
  marshalOuterX[0].IsBase64 = false;
  marshalOuterX[0].ChildStructDescriptionCount = 1;
  marshalOuterX[1].Name = "struct1Var";
  marshalOuterX[1].IsArray = true;
  marshalOuterX[1].FieldOffset = 0x28;
  marshalOuterX[1].FieldSize = 8;
  marshalOuterX[1].CountFieldOffset = 0x30;
  marshalOuterX[1].CountFieldSize = 8;
  marshalOuterX[1].ArrayFieldSize = 0;
  marshalOuterX[1].ArrayItemSize = 8;
  marshalOuterX[1].NumberType = JL_NUM_TYPE_NONE;
  marshalOuterX[1].IsHex = false;
  marshalOuterX[1].IsBase64 = false;
  marshalOuterX[2].Name = "struct2Fixed";
  marshalOuterX[2].IsArray = true;
  marshalOuterX[2].FieldOffset = 0x38;
  marshalOuterX[2].FieldSize = 8;
  marshalOuterX[2].CountFieldOffset = 0x40;
  marshalOuterX[2].CountFieldSize = 8;
  marshalOuterX[2].ArrayFieldSize = 8;
  marshalOuterX[2].ArrayItemSize = 2;
  marshalOuterX[2].NumberType = JL_NUM_TYPE_NONE;
  marshalOuterX[2].IsHex = false;
  marshalOuterX[2].IsBase64 = false;
  marshalOuterX[3].Name = "struct2Var";
  marshalOuterX[3].IsArray = true;
  marshalOuterX[3].FieldOffset = 0x48;
  marshalOuterX[3].FieldSize = 8;
  marshalOuterX[3].CountFieldOffset = 0x50;
  marshalOuterX[3].CountFieldSize = 8;
  marshalOuterX[3].ArrayFieldSize = 0;
  marshalOuterX[3].ArrayItemSize = 2;
  marshalOuterX[3].NumberType = JL_NUM_TYPE_NONE;
  marshalOuterX[3].IsHex = false;
  marshalOuterX[3].IsBase64 = false;
  theStructX.struct2FixedCount = 0;
  theStructX.struct2Var = (InnerStructX2 *)0x0;
  theStructX.struct1VarCount = 0;
  theStructX.struct2Fixed[0].Number16 = 0;
  theStructX.struct2Fixed[1].Number16 = 0;
  theStructX.struct2Fixed[2].Number16 = 0;
  theStructX.struct2Fixed[3].Number16 = 0;
  theStructX.struct1FixedCount = 0;
  theStructX.struct1Var = (InnerStructX1 *)0x0;
  theStructX.struct1Fixed[2].Number64 = 0;
  theStructX.struct1Fixed[3].Number64 = 0;
  theStructX.struct1Fixed[0].Number64 = 0;
  theStructX.struct1Fixed[1].Number64 = 0;
  theStructX.struct2VarCount = 0;
  marshalOuterX[0].ChildStructDescription = marshalStructX1;
  marshalOuterX[1].Type = marshalOuterX[0].Type;
  marshalOuterX[1].ChildStructDescription = marshalStructX1;
  marshalOuterX[1].ChildStructDescriptionCount = marshalOuterX[0].ChildStructDescriptionCount;
  marshalOuterX[2].Type = marshalOuterX[0].Type;
  marshalOuterX[2].ChildStructDescriptionCount = marshalOuterX[0].ChildStructDescriptionCount;
  marshalOuterX[3].Type = marshalOuterX[0].Type;
  marshalOuterX[3].ChildStructDescription = marshalOuterX[2].ChildStructDescription;
  marshalOuterX[3].ChildStructDescriptionCount = marshalOuterX[0].ChildStructDescriptionCount;
  WVar1 = MakeJsonAndVerify(&theStructX,marshalOuterX,4,
                            "{\"struct1Fixed\":[],\"struct1Var\":[],\"struct2Fixed\":[],\"struct2Var\":[]}"
                           );
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStructX, marshalOuterX, ( sizeof(marshalOuterX) / sizeof((marshalOuterX)[0]) ), \"{\\\"struct1Fixed\\\":[],\\\"struct1Var\\\":[],\" \"\\\"struct2Fixed\\\":[],\\\"struct2Var\\\":[]}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallArrayStructs",0x260);
  theStructX.struct1Fixed[0].Number64 = 1;
  theStructX.struct1Fixed[1].Number64 = 2;
  theStructX.struct1Fixed[2].Number64 = 3;
  theStructX.struct1FixedCount = 3;
  theStructX.struct1Var = &local_2f8;
  local_2e8 = 0;
  uStack_2e0 = 0;
  local_2f8.Number64 = 4;
  local_2f0 = 5;
  theStructX.struct1VarCount = 2;
  theStructX.struct2Fixed[0].Number16 = 6;
  theStructX.struct2Fixed[1].Number16 = 7;
  theStructX.struct2Fixed[2].Number16 = 8;
  theStructX.struct2FixedCount = 3;
  theStructX.struct2Var = (InnerStructX2 *)&local_300;
  local_300 = 0xa0009;
  theStructX.struct2VarCount = 2;
  WVar2 = MakeJsonAndVerify(&theStructX,marshalOuterX,4,
                            "{\"struct1Fixed\":[{\"num64\":1},{\"num64\":2},{\"num64\":3}],\"struct1Var\":[{\"num64\":4},{\"num64\":5}],\"struct2Fixed\":[{\"num16\":6},{\"num16\":7},{\"num16\":8}],\"struct2Var\":[{\"num16\":9},{\"num16\":10}]}"
                           );
  WjTestLib_Assert(WVar2 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStructX, marshalOuterX, ( sizeof(marshalOuterX) / sizeof((marshalOuterX)[0]) ), \"{\\\"struct1Fixed\\\":[{\\\"num64\\\":1},{\\\"num64\\\":2},{\\\"num64\\\":3}],\" \"\\\"struct1Var\\\":[{\\\"num64\\\":4},{\\\"num64\\\":5}],\" \"\\\"struct2Fixed\\\":[{\\\"num16\\\":6},{\\\"num16\\\":7},{\\\"num16\\\":8}],\" \"\\\"struct2Var\\\":[{\\\"num16\\\":9},{\\\"num16\\\":10}]}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallArrayStructs",0x27b);
  WVar3 = WJTL_STATUS_FAILED;
  if (WVar2 == WJTL_STATUS_SUCCESS && WVar1 == WJTL_STATUS_SUCCESS) {
    WVar3 = WJTL_STATUS_SUCCESS;
  }
  return WVar3;
}

Assistant:

static
WJTL_STATUS
    TestMarshallArrayStructs
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;

    typedef struct
    {
        uint64_t    Number64;
    } InnerStructX1;

    typedef struct
    {
        uint16_t    Number16;
    } InnerStructX2;

    typedef struct
    {
        InnerStructX1   struct1Fixed[4];
        size_t          struct1FixedCount;
        InnerStructX1*  struct1Var;
        size_t          struct1VarCount;
        InnerStructX2   struct2Fixed[4];
        size_t          struct2FixedCount;
        InnerStructX2*  struct2Var;
        size_t          struct2VarCount;
    } OuterStructX;

    JlMarshallElement marshalStructX1[] =
    {
        JlMarshallUnsigned( InnerStructX1, Number64, "num64" ),
    };
    JlMarshallElement marshalStructX2[] =
    {
        JlMarshallUnsigned( InnerStructX2, Number16, "num16" ),
    };
    JlMarshallElement marshalOuterX[] =
    {
        JlMarshallStructFixedArray( OuterStructX, struct1Fixed, struct1FixedCount, "struct1Fixed", InnerStructX1, marshalStructX1, NumElements(marshalStructX1) ),
        JlMarshallStructArray( OuterStructX, struct1Var, struct1VarCount, "struct1Var", InnerStructX1, marshalStructX1, NumElements(marshalStructX1) ),
        JlMarshallStructFixedArray( OuterStructX, struct2Fixed, struct2FixedCount, "struct2Fixed", InnerStructX2, marshalStructX2, NumElements(marshalStructX2) ),
        JlMarshallStructArray( OuterStructX, struct2Var, struct2VarCount, "struct2Var", InnerStructX2, marshalStructX2, NumElements(marshalStructX2) ),
    };

    OuterStructX theStructX = {{{0}}};

    // Test empty
    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStructX, marshalOuterX, NumElements(marshalOuterX),
                                          "{\"struct1Fixed\":[],\"struct1Var\":[],"
                                          "\"struct2Fixed\":[],\"struct2Var\":[]}" ) );

    // Now with data
    theStructX.struct1Fixed[0].Number64 = 1;
    theStructX.struct1Fixed[1].Number64 = 2;
    theStructX.struct1Fixed[2].Number64 = 3;
    theStructX.struct1FixedCount = 3;
    InnerStructX1 inner1 [4] = {{0}};
    inner1[0].Number64 = 4;
    inner1[1].Number64 = 5;
    theStructX.struct1Var = inner1;
    theStructX.struct1VarCount = 2;

    theStructX.struct2Fixed[0].Number16 = 6;
    theStructX.struct2Fixed[1].Number16 = 7;
    theStructX.struct2Fixed[2].Number16 = 8;
    theStructX.struct2FixedCount = 3;
    InnerStructX2 inner2 [4] = {{0}};
    inner2[0].Number16 = 9;
    inner2[1].Number16 = 10;
    theStructX.struct2Var = inner2;
    theStructX.struct2VarCount = 2;

    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStructX, marshalOuterX, NumElements(marshalOuterX),
                                          "{\"struct1Fixed\":[{\"num64\":1},{\"num64\":2},{\"num64\":3}],"
                                          "\"struct1Var\":[{\"num64\":4},{\"num64\":5}],"
                                          "\"struct2Fixed\":[{\"num16\":6},{\"num16\":7},{\"num16\":8}],"
                                          "\"struct2Var\":[{\"num16\":9},{\"num16\":10}]}" ) );

    return TestReturn;
}